

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warrior.c
# Opt level: O0

int style_count(long *bits)

{
  ulong uVar1;
  long in_RDI;
  __type_conflict2 _Var2;
  int i;
  int count;
  long in_stack_ffffffffffffffd8;
  int local_10;
  int local_c;
  
  local_c = 0;
  for (local_10 = 1; local_10 < 7; local_10 = local_10 + 1) {
    uVar1 = *(ulong *)(in_RDI + (long)(int)(style_table[local_10].bit / 0x20) * 8);
    _Var2 = std::pow<int,long>((int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffd8);
    if ((uVar1 & (long)_Var2) != 0) {
      local_c = local_c + 1;
    }
  }
  return local_c;
}

Assistant:

int style_count(long bits[])
{
	int count = 0;

	for (int i = 1; i < MAX_STYLE; i++)
	{
		if (IS_SET(bits, style_table[i].bit))
			count++;
	}

	return count;
}